

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::Pipeline::_InternalParse(Pipeline *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  Model *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint32_t tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
LAB_001c3fd4:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
    if (bVar1) {
      return local_40;
    }
    local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
    tag_00 = local_34;
    if (local_34 >> 3 == 2) {
      if ((char)local_34 == '\x12') {
        local_40 = local_40 + -1;
        do {
          local_40 = local_40 + 1;
          pbVar2 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(&this->names_);
          local_40 = google::protobuf::internal::InlineGreedyStringParser(pbVar2,local_40,ctx);
          bVar1 = google::protobuf::internal::VerifyUTF8(pbVar2,(char *)0x0);
          if (!bVar1) {
            return (char *)0x0;
          }
          if (local_40 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == '\x12'));
        goto LAB_001c3fd4;
      }
    }
    else if ((local_34 >> 3 == 1) && ((char)local_34 == '\n')) {
      local_40 = local_40 + -1;
      do {
        local_40 = local_40 + 1;
        msg = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::Add(&this->models_);
        local_40 = google::protobuf::internal::ParseContext::ParseMessage
                             (ctx,&msg->super_MessageLite,local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == '\n'));
      goto LAB_001c3fd4;
    }
    if ((local_34 == 0) || ((local_34 & 7) == 4)) {
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
      return local_40;
    }
    pbVar2 = google::protobuf::internal::InternalMetadata::
             mutable_unknown_fields<std::__cxx11::string>
                       (&(this->super_MessageLite)._internal_metadata_);
    local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,pbVar2,local_40,ctx);
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Pipeline::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.Model models = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_models(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated string names = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_names();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}